

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

void __thiscall VertexClustering::computeClusters(VertexClustering *this,bool constrain)

{
  double dVar1;
  VertexClustering *pVVar2;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *pqVar3;
  bool bVar4;
  _Elt_pointer pVVar5;
  iterator iVar6;
  clock_t cVar7;
  ulong uVar8;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *this_00;
  uint uVar9;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *q2;
  VCEdge e;
  set<VCEdge,_VCEdgeItemCmp,_std::allocator<VCEdge>_> tested;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> boundary_next;
  key_type local_e8;
  VertexClustering *local_d0;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *local_c8;
  clock_t local_c0;
  _Rb_tree<VCEdge,_VCEdge,_std::_Identity<VCEdge>,_VCEdgeItemCmp,_std::allocator<VCEdge>_> local_b8;
  _Deque_base<VCEdge,_std::allocator<VCEdge>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<VCEdge,_std::allocator<VCEdge>_>::_M_initialize_map(&local_88,0);
  local_c0 = clock();
  dVar1 = totalEnergy(this);
  local_d0 = this;
  printf("---start clustering, with total energy: %.12lf---\n",SUB84(dVar1,0));
  uVar9 = 0;
  pqVar3 = &this->boundary;
  q2 = (queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)&local_88;
  local_c8 = &this->boundary;
  do {
    this_00 = pqVar3;
    pVVar2 = local_d0;
    local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    uVar8 = 0;
    local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_b8._M_impl.super__Rb_tree_header._M_header;
    local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
    pVVar5 = (((_Deque_impl_data *)&(this_00->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>)
             ->_M_start)._M_cur;
    local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((((_Deque_impl_data *)&(this_00->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>)->
        _M_finish)._M_cur != pVVar5) {
      uVar8 = 0;
      do {
        local_e8.f1 = pVVar5->f1;
        local_e8.f2 = pVVar5->f2;
        std::deque<VCEdge,_std::allocator<VCEdge>_>::pop_front(&this_00->c);
        if (((local_e8.f2 != (VCFace *)0x0) && (local_e8.f1 != (VCFace *)0x0)) &&
           ((local_e8.f1)->cluster != (local_e8.f2)->cluster)) {
          iVar6 = std::
                  _Rb_tree<VCEdge,_VCEdge,_std::_Identity<VCEdge>,_VCEdgeItemCmp,_std::allocator<VCEdge>_>
                  ::find(&local_b8,&local_e8);
          if ((_Rb_tree_header *)iVar6._M_node == &local_b8._M_impl.super__Rb_tree_header) {
            std::_Rb_tree<VCEdge,VCEdge,std::_Identity<VCEdge>,VCEdgeItemCmp,std::allocator<VCEdge>>
            ::_M_insert_unique<VCEdge_const&>
                      ((_Rb_tree<VCEdge,VCEdge,std::_Identity<VCEdge>,VCEdgeItemCmp,std::allocator<VCEdge>>
                        *)&local_b8,&local_e8);
            bVar4 = localEnergyRelease(pVVar2,(local_e8.f1)->cluster,(local_e8.f2)->cluster,
                                       &local_e8,q2,constrain);
            uVar8 = (ulong)((int)uVar8 + (uint)bVar4);
          }
        }
        pVVar5 = (((_Deque_impl_data *)
                  &(this_00->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>)->_M_start).
                 _M_cur;
      } while ((((_Deque_impl_data *)
                &(this_00->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>)->_M_finish)._M_cur
               != pVVar5);
    }
    uVar9 = uVar9 + 1;
    printf("iteration: %d, modification: %d, ",(ulong)uVar9,uVar8);
    dVar1 = totalEnergy(pVVar2);
    printf("total energy: %.12lf\n",SUB84(dVar1,0));
    std::_Rb_tree<VCEdge,_VCEdge,_std::_Identity<VCEdge>,_VCEdgeItemCmp,_std::allocator<VCEdge>_>::
    ~_Rb_tree(&local_b8);
    pVVar2 = local_d0;
    pqVar3 = q2;
    q2 = this_00;
  } while (0 < (int)uVar8);
  if ((local_d0->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (local_d0->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    std::deque<VCEdge,_std::allocator<VCEdge>_>::operator=
              (&local_c8->c,(deque<VCEdge,_std::allocator<VCEdge>_> *)&local_88);
  }
  cVar7 = clock();
  printf("Done, uses %lf s for clustering.\n",SUB84((double)(cVar7 - local_c0) / 1000000.0,0));
  dVar1 = totalEnergy(pVVar2);
  printf("---total energy: %.12lf---\n",SUB84(dVar1,0));
  std::_Deque_base<VCEdge,_std::allocator<VCEdge>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void VertexClustering::computeClusters(bool constrain)
{
	queue<VCEdge> boundary_next;
	queue<VCEdge> *q1 = &boundary, *q2 = &boundary_next;
	int modification;
	int iteration = 0;
	clock_t start = clock();
	printf("---start clustering, with total energy: %.12lf---\n", totalEnergy());
	do {
		modification = 0;
		set<VCEdge, VCEdgeItemCmp> tested;
		while (!q1->empty()) {
			VCEdge e = q1->front();
			q1->pop();
			if (e.isBoundary() && tested.find(e) == tested.end()) {
				tested.insert(e);
				VCCluster *c1 = e.f1->cluster;
				VCCluster *c2 = e.f2->cluster;
				if (localEnergyRelease(c1, c2, e, q2, constrain)) {
					modification++;
				}
			}
		}
		printf("iteration: %d, modification: %d, ", ++iteration, modification);
		printf("total energy: %.12lf\n", totalEnergy());
		std::swap(q1, q2);
	} while (modification > 0);
	if (boundary.empty())
		boundary = boundary_next;

	printf("Done, uses %lf s for clustering.\n", (double)(clock() - start) / CLOCKS_PER_SEC);
	printf("---total energy: %.12lf---\n", totalEnergy());
}